

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void xPredIntraAngAdi_XY_20(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  void *local_100;
  pel *pfirst;
  int i;
  int line_size;
  int top_size;
  int left_size;
  pel first_line [192];
  int iHeight_local;
  int iWidth_local;
  int uiDirMode_local;
  int i_dst_local;
  pel *dst_local;
  pel *pSrc_local;
  
  line_size = (iHeight + -1) * 2 + 1;
  local_100 = (void *)((long)&line_size + (long)line_size + 3);
  dst_local = pSrc + -(long)iHeight;
  first_line._184_4_ = iHeight;
  first_line._188_4_ = iWidth;
  for (pfirst._0_4_ = 0; (int)pfirst < line_size; pfirst._0_4_ = (int)pfirst + 2) {
    *(char *)((long)&top_size + (long)(int)pfirst) =
         (char)((int)((uint)dst_local[-1] + ((uint)*dst_local + (uint)dst_local[1]) * 3 +
                      (uint)dst_local[2] + 4) >> 3);
    *(char *)((long)&top_size + (long)((int)pfirst + 1)) =
         (char)((int)((uint)*dst_local + (uint)dst_local[1] * 2 + (uint)dst_local[2] + 2) >> 2);
    dst_local = dst_local + 1;
  }
  for (pfirst._0_4_ = (int)pfirst + -1; (int)pfirst < line_size + iWidth + -1;
      pfirst._0_4_ = (int)pfirst + 1) {
    *(char *)((long)&top_size + (long)(int)pfirst) =
         (char)((int)((uint)dst_local[-1] + (uint)*dst_local * 2 + (uint)dst_local[1] + 2) >> 2);
    dst_local = dst_local + 1;
  }
  _uiDirMode_local = dst;
  for (pfirst._0_4_ = 0; (int)pfirst < (int)first_line._184_4_; pfirst._0_4_ = (int)pfirst + 1) {
    memcpy(_uiDirMode_local,local_100,(long)(int)first_line._188_4_);
    local_100 = (void *)((long)local_100 + -2);
    _uiDirMode_local = _uiDirMode_local + i_dst;
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_20(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    ALIGNED_16(pel first_line[64 + 128]);
    int left_size = (iHeight - 1) * 2 + 1;
    int top_size = iWidth - 1;
    int line_size = left_size + top_size;
    int i;
    pel *pfirst = first_line + left_size - 1;

    pSrc -= iHeight;

    for (i = 0; i < left_size; i += 2, pSrc++) {
        first_line[i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
        first_line[i + 1] = (pSrc[0] + pSrc[1] * 2 + pSrc[2] + 2) >> 2;
    }
    i--;

    for (; i < line_size; i++, pSrc++) {
        first_line[i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
    }

    for (i = 0; i < iHeight; i++) {
        memcpy(dst, pfirst, iWidth * sizeof(pel));
        pfirst -= 2;
        dst += i_dst;
    }
}